

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tiny_obj_loader.h
# Opt level: O0

bool tinyobj::parseTriple(char **token,int vsize,int vnsize,int vtsize,vertex_index_t *ret)

{
  bool bVar1;
  int iVar2;
  size_t sVar3;
  undefined1 local_3c [8];
  vertex_index_t vi;
  vertex_index_t *ret_local;
  int vtsize_local;
  int vnsize_local;
  int vsize_local;
  char **token_local;
  
  if (ret == (vertex_index_t *)0x0) {
    token_local._7_1_ = false;
  }
  else {
    vi._4_8_ = ret;
    vertex_index_t::vertex_index_t((vertex_index_t *)local_3c,-1);
    iVar2 = atoi(*token);
    bVar1 = fixIndex(iVar2,vsize,(int *)local_3c);
    if (bVar1) {
      sVar3 = strcspn(*token,"/ \t\r");
      *token = *token + sVar3;
      if (**token == '/') {
        *token = *token + 1;
        if (**token == '/') {
          *token = *token + 1;
          iVar2 = atoi(*token);
          bVar1 = fixIndex(iVar2,vnsize,&vi.v_idx);
          if (bVar1) {
            sVar3 = strcspn(*token,"/ \t\r");
            *token = *token + sVar3;
            *(undefined1 (*) [8])vi._4_8_ = local_3c;
            *(int *)(vi._4_8_ + 8) = vi.v_idx;
            token_local._7_1_ = true;
          }
          else {
            token_local._7_1_ = false;
          }
        }
        else {
          iVar2 = atoi(*token);
          bVar1 = fixIndex(iVar2,vtsize,(int *)(local_3c + 4));
          if (bVar1) {
            sVar3 = strcspn(*token,"/ \t\r");
            *token = *token + sVar3;
            if (**token == '/') {
              *token = *token + 1;
              iVar2 = atoi(*token);
              bVar1 = fixIndex(iVar2,vnsize,&vi.v_idx);
              if (bVar1) {
                sVar3 = strcspn(*token,"/ \t\r");
                *token = *token + sVar3;
                *(undefined1 (*) [8])vi._4_8_ = local_3c;
                *(int *)(vi._4_8_ + 8) = vi.v_idx;
                token_local._7_1_ = true;
              }
              else {
                token_local._7_1_ = false;
              }
            }
            else {
              *(undefined1 (*) [8])vi._4_8_ = local_3c;
              *(int *)(vi._4_8_ + 8) = vi.v_idx;
              token_local._7_1_ = true;
            }
          }
          else {
            token_local._7_1_ = false;
          }
        }
      }
      else {
        *(undefined1 (*) [8])vi._4_8_ = local_3c;
        *(int *)(vi._4_8_ + 8) = vi.v_idx;
        token_local._7_1_ = true;
      }
    }
    else {
      token_local._7_1_ = false;
    }
  }
  return token_local._7_1_;
}

Assistant:

static bool parseTriple(const char **token, int vsize, int vnsize, int vtsize,
                        vertex_index_t *ret) {
  if (!ret) {
    return false;
  }

  vertex_index_t vi(-1);

  if (!fixIndex(atoi((*token)), vsize, &(vi.v_idx))) {
    return false;
  }

  (*token) += strcspn((*token), "/ \t\r");
  if ((*token)[0] != '/') {
    (*ret) = vi;
    return true;
  }
  (*token)++;

  // i//k
  if ((*token)[0] == '/') {
    (*token)++;
    if (!fixIndex(atoi((*token)), vnsize, &(vi.vn_idx))) {
      return false;
    }
    (*token) += strcspn((*token), "/ \t\r");
    (*ret) = vi;
    return true;
  }

  // i/j/k or i/j
  if (!fixIndex(atoi((*token)), vtsize, &(vi.vt_idx))) {
    return false;
  }

  (*token) += strcspn((*token), "/ \t\r");
  if ((*token)[0] != '/') {
    (*ret) = vi;
    return true;
  }

  // i/j/k
  (*token)++;  // skip '/'
  if (!fixIndex(atoi((*token)), vnsize, &(vi.vn_idx))) {
    return false;
  }
  (*token) += strcspn((*token), "/ \t\r");

  (*ret) = vi;

  return true;
}